

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::GeometryShaderTests::init(GeometryShaderTests *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  TestNodeType TVar5;
  int iVar6;
  deUint32 primitive;
  Context *pCVar7;
  pointer pcVar8;
  char *pcVar9;
  pointer name_00;
  int legalNdx;
  GeometryShaderInputType GVar10;
  int extraout_EAX;
  TestNode *pTVar11;
  TestNode *pTVar12;
  TestNode *pTVar13;
  TestNode *node;
  GeometryProgramLimitCase *pGVar14;
  OutputCountCase *pOVar15;
  long *plVar16;
  undefined8 *puVar17;
  LayeredRenderCase *pLVar18;
  bool bVar19;
  size_type *psVar20;
  long *plVar21;
  GeometryShaderInputType inputType;
  GeometryShaderInputType inputType_00;
  uint uVar22;
  ulong uVar23;
  undefined8 uVar24;
  GeometryShaderTests *pGVar25;
  bool bVar26;
  char *__end;
  long lVar27;
  long lVar28;
  string desc;
  string name;
  ostringstream s;
  ulong *in_stack_fffffffffffffcc8;
  ulong *puVar29;
  ulong *puVar30;
  ulong local_328;
  long lStack_320;
  ulong *local_318;
  long local_310;
  ulong local_308;
  long lStack_300;
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8;
  long lStack_2e0;
  string local_2d8;
  string local_2b8;
  string local_298;
  GeometryShaderTests *local_278;
  ulong *local_270;
  long local_268;
  ulong local_260 [2];
  TestNode *local_250;
  ulong *local_248;
  long local_240;
  ulong local_238 [2];
  TestNode *local_228;
  allocator<char> local_219;
  TestNode *local_218;
  undefined8 uStack_210;
  TestNode *local_208;
  TestNode *local_200;
  OutputCountPatternSpec local_1f8;
  long lStack_1e0;
  ios_base local_188 [264];
  TestNode *local_80;
  TestNode *local_78;
  TestNode *local_70;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  TestNode *local_48;
  TestNode *local_40;
  TestNode *local_38;
  
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"query",
             "Query tests.");
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic tests.");
  pTVar13 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"input",
             "Different input primitives.");
  local_78 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_78,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"conversion",
             "Different input and output primitives.");
  local_80 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_80,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"emit",
             "Different emit counts.");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"varying",
             "Test varyings.");
  local_228 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_228,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"layered",
             "Layered rendering.");
  local_250 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_250,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"instanced",
             "Instanced rendering.");
  local_218 = pTVar12;
  local_70 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"negative",
             "Negative tests.");
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "vertex_transform_feedback","Transform feedback.");
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  tcu::TestNode::addChild((TestNode *)this,local_218);
  local_38 = pTVar13;
  tcu::TestNode::addChild((TestNode *)this,pTVar13);
  tcu::TestNode::addChild((TestNode *)this,local_78);
  tcu::TestNode::addChild((TestNode *)this,local_80);
  local_40 = node;
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,local_228);
  tcu::TestNode::addChild((TestNode *)this,local_250);
  tcu::TestNode::addChild((TestNode *)this,local_70);
  local_48 = pTVar12;
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar7 = (this->super_TestCaseGroup).m_context;
  local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"MaxGeometryInputComponents","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar7,"max_geometry_input_components",(char *)0x9123,(GLenum)&local_1f8,
             (string *)0x40,(int)in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar7 = (this->super_TestCaseGroup).m_context;
  local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"MaxGeometryOutputComponents","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar7,"max_geometry_output_components",(char *)0x9124,(GLenum)&local_1f8,
             (string *)0x40,(int)in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar7 = (this->super_TestCaseGroup).m_context;
  local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"MaxGeometryImageUniforms","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar7,"max_geometry_image_uniforms",(char *)0x90cd,(GLenum)&local_1f8,
             (string *)0x0,(int)in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar7 = (this->super_TestCaseGroup).m_context;
  local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"MaxGeometryTextureImageUnits","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar7,"max_geometry_texture_image_units",(char *)0x8c29,(GLenum)&local_1f8,
             (string *)&DAT_00000010,(int)in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar7 = (this->super_TestCaseGroup).m_context;
  local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"MaxGeometryOutputVertices","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar7,"max_geometry_output_vertices",(char *)0x8de0,(GLenum)&local_1f8,
             (string *)0x100,(int)in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar7 = (this->super_TestCaseGroup).m_context;
  local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"MaxGeometryTotalOutputComponents","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar7,"max_geometry_total_output_components",(char *)0x8de1,(GLenum)&local_1f8
             ,(string *)0x400,(int)in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar7 = (this->super_TestCaseGroup).m_context;
  local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"MaxGeometryUniformComponents","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar7,"max_geometry_uniform_components",(char *)0x8ddf,(GLenum)&local_1f8,
             (string *)0x400,(int)in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar7 = (this->super_TestCaseGroup).m_context;
  local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"MaxGeometryAtomicCounters","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar7,"max_geometry_atomic_counters",(char *)0x92d5,(GLenum)&local_1f8,
             (string *)0x0,(int)in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar7 = (this->super_TestCaseGroup).m_context;
  local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"MaxGeometryAtomicCounterBuffers","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar7,"max_geometry_atomic_counter_buffers",(char *)0x92cf,(GLenum)&local_1f8,
             (string *)0x0,(int)in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pTVar12 = (TestNode *)operator_new(0x98);
  pCVar7 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"geometry_linked_vertices_out",
             "GL_GEOMETRY_LINKED_VERTICES_OUT");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  *(undefined4 *)&pTVar12[1].m_testCtx = 0x8916;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar12[1].m_name._M_string_length = 0;
  pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryProgramQueryCase_0215ea78;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
  ::resize((vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
            *)&pTVar12[1].m_name,1);
  pcVar8 = pTVar12[1].m_name._M_dataplus._M_p;
  *(char **)pcVar8 = "max_vertices = 1";
  *(char **)(pcVar8 + 8) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (points, max_vertices = 1) out;\n"
  ;
  pcVar8[0x10] = '\x01';
  pcVar8[0x11] = '\0';
  pcVar8[0x12] = '\0';
  pcVar8[0x13] = '\0';
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x98);
  pCVar7 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"geometry_linked_input_type",
             "GL_GEOMETRY_LINKED_INPUT_TYPE");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  *(undefined4 *)&pTVar12[1].m_testCtx = 0x8917;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar12[1].m_name._M_string_length = 0;
  pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryProgramQueryCase_0215eb18;
  local_278 = this;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
  ::resize((vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
            *)&pTVar12[1].m_name,3);
  pcVar8 = pTVar12[1].m_name._M_dataplus._M_p;
  *(char **)pcVar8 = "Triangles";
  *(char **)(pcVar8 + 8) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pcVar8[0x10] = '\x04';
  pcVar8[0x11] = '\0';
  pcVar8[0x12] = '\0';
  pcVar8[0x13] = '\0';
  *(char **)(pcVar8 + 0x18) = "Lines";
  *(char **)(pcVar8 + 0x20) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (lines) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pcVar8[0x28] = '\x01';
  pcVar8[0x29] = '\0';
  pcVar8[0x2a] = '\0';
  pcVar8[0x2b] = '\0';
  *(char **)(pcVar8 + 0x30) = "Points";
  *(char **)(pcVar8 + 0x38) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (points) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pcVar8[0x40] = '\0';
  pcVar8[0x41] = '\0';
  pcVar8[0x42] = '\0';
  pcVar8[0x43] = '\0';
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x98);
  pCVar7 = (local_278->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"geometry_linked_output_type",
             "GL_GEOMETRY_LINKED_OUTPUT_TYPE");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  *(undefined4 *)&pTVar12[1].m_testCtx = 0x8918;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar12[1].m_name._M_string_length = 0;
  pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryProgramQueryCase_0215eb68;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
  ::resize((vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
            *)&pTVar12[1].m_name,3);
  pcVar8 = pTVar12[1].m_name._M_dataplus._M_p;
  *(char **)pcVar8 = "Triangle strip";
  *(char **)(pcVar8 + 8) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (triangle_strip, max_vertices = 3) out;\n"
  ;
  pcVar8[0x10] = '\x05';
  pcVar8[0x11] = '\0';
  pcVar8[0x12] = '\0';
  pcVar8[0x13] = '\0';
  *(char **)(pcVar8 + 0x18) = "Lines";
  *(char **)(pcVar8 + 0x20) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (line_strip, max_vertices = 3) out;\n"
  ;
  pcVar8[0x28] = '\x03';
  pcVar8[0x29] = '\0';
  pcVar8[0x2a] = '\0';
  pcVar8[0x2b] = '\0';
  *(char **)(pcVar8 + 0x30) = "Points";
  *(char **)(pcVar8 + 0x38) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pcVar8[0x40] = '\0';
  pcVar8[0x41] = '\0';
  pcVar8[0x42] = '\0';
  pcVar8[0x43] = '\0';
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x98);
  pCVar7 = (local_278->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"geometry_shader_invocations",
             "GL_GEOMETRY_SHADER_INVOCATIONS");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  *(undefined4 *)&pTVar12[1].m_testCtx = 0x887f;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar12[1].m_name._M_string_length = 0;
  pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryProgramQueryCase_0215ebb8;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
  ::resize((vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
            *)&pTVar12[1].m_name,2);
  pcVar8 = pTVar12[1].m_name._M_dataplus._M_p;
  *(char **)pcVar8 = "Default value";
  *(char **)(pcVar8 + 8) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pcVar8[0x10] = '\x01';
  pcVar8[0x11] = '\0';
  pcVar8[0x12] = '\0';
  pcVar8[0x13] = '\0';
  *(char **)(pcVar8 + 0x18) = "Value declared";
  *(char **)(pcVar8 + 0x20) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles, invocations=2) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pcVar8[0x28] = '\x02';
  pcVar8[0x29] = '\0';
  pcVar8[0x2a] = '\0';
  pcVar8[0x2b] = '\0';
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x80);
  pGVar25 = local_278;
  pCVar7 = (local_278->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"max_geometry_shader_invocations",
             ::glcts::fixed_sample_locations_values + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215ec08;
  pTVar12[1].m_testCtx = (TestContext *)0x2000008e5a;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x80);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"max_geometry_uniform_blocks",
             ::glcts::fixed_sample_locations_values + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215ec08;
  pTVar12[1].m_testCtx = (TestContext *)0xc00008a2c;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x80);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"max_geometry_shader_storage_blocks",
             ::glcts::fixed_sample_locations_values + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215ec08;
  pTVar12[1].m_testCtx = (TestContext *)0x90d7;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x78);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"layer_provoking_vertex",
             "GL_LAYER_PROVOKING_VERTEX");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215ec58;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x88);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"primitives_generated_no_geometry",
             "PRIMITIVES_GENERATED query with no geometry shader");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__PrimitivesGeneratedQueryCase_0215eca8;
  *(undefined4 *)&pTVar12[1].m_testCtx = 0;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x88);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"primitives_generated_no_amplification",
             "PRIMITIVES_GENERATED query with non amplifying geometry shader");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__PrimitivesGeneratedQueryCase_0215eca8;
  *(undefined4 *)&pTVar12[1].m_testCtx = 1;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x88);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"primitives_generated_amplification",
             "PRIMITIVES_GENERATED query with amplifying geometry shader");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__PrimitivesGeneratedQueryCase_0215eca8;
  *(undefined4 *)&pTVar12[1].m_testCtx = 2;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x88);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"primitives_generated_partial_primitives",
             "PRIMITIVES_GENERATED query with geometry shader emitting partial primitives");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__PrimitivesGeneratedQueryCase_0215eca8;
  *(undefined4 *)&pTVar12[1].m_testCtx = 3;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x88);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"primitives_generated_instanced",
             "PRIMITIVES_GENERATED query with instanced geometry shader");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__PrimitivesGeneratedQueryCase_0215eca8;
  *(undefined4 *)&pTVar12[1].m_testCtx = 4;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x78);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"primitives_generated",
             "Query bound PRIMITIVES_GENERATED query");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215ecf8;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x80);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"max_framebuffer_layers",
             ::glcts::fixed_sample_locations_values + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215ec08;
  pTVar12[1].m_testCtx = (TestContext *)0x10000009317;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x78);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"framebuffer_default_layers",
             ::glcts::fixed_sample_locations_values + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215ed48;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x78);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"framebuffer_attachment_layered",
             ::glcts::fixed_sample_locations_values + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215edb0;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x78);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"framebuffer_incomplete_layer_targets",
             ::glcts::fixed_sample_locations_values + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215ee90;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x78);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar7->m_testCtx,"referenced_by_geometry_shader",
             ::glcts::fixed_sample_locations_values + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215eee0;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar13 = (TestNode *)operator_new(0x78);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar13,pCVar7->m_testCtx,"max_combined_geometry_uniform_components",
             "MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS");
  pTVar12 = local_218;
  pTVar13[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215ef30;
  tcu::TestNode::addChild(pTVar11,pTVar13);
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f8,10);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar7,"output_10","Output 10 vertices",&local_1f8);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f8,0x80);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar7,"output_128","Output 128 vertices",&local_1f8);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f8,0x100);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar7,"output_256","Output 256 vertices",&local_1f8);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f8,-1);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar7,"output_max","Output max vertices",&local_1f8);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f8,10,100);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar7,"output_10_and_100","Output 10 and 100 vertices in two invocations",
             &local_1f8);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f8,100,10);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar7,"output_100_and_10","Output 100 and 10 vertices in two invocations",
             &local_1f8);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f8,0,0x80);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar7,"output_0_and_128","Output 0 and 128 vertices in two invocations",
             &local_1f8);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f8,0x80,0);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar7,"output_128_and_0","Output 128 and 0 vertices in two invocations",
             &local_1f8);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pTVar11 = (TestNode *)operator_new(0x130);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar7->m_testCtx,"output_vary_by_attribute",
             "Output varying number of vertices");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
  pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_emitCount";
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f0e0;
  pTVar11[2].m_description._M_string_length = 0;
  pTVar11[2].m_description.field_2._M_allocated_capacity = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description.field_2 + 8) = 0;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x130);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar7->m_testCtx,"output_vary_by_uniform",
             "Output varying number of vertices");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
  pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_vertexNdx";
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f0e0;
  pTVar11[2].m_description._M_string_length = 0;
  pTVar11[2].m_description.field_2._M_allocated_capacity = 1;
  *(undefined4 *)((long)&pTVar11[2].m_description.field_2 + 8) = 0;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x130);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar7->m_testCtx,"output_vary_by_texture",
             "Output varying number of vertices");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
  pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_vertexNdx";
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f0e0;
  pTVar11[2].m_description._M_string_length = 0;
  pTVar11[2].m_description.field_2._M_allocated_capacity = 2;
  *(undefined4 *)((long)&pTVar11[2].m_description.field_2 + 8) = 0;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x128);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar11,pCVar7->m_testCtx,"point_size","test gl_PointSize");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 0;
  pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_pointSize";
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f1d0;
  pTVar11[2].m_description._M_string_length = 0;
  *(undefined4 *)&pTVar11[2].m_description.field_2 = 0;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x128);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar7->m_testCtx,"primitive_id_in","test gl_PrimitiveIDIn");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 0;
  pTVar11[1].m_name.field_2._M_allocated_capacity = 0x1af8059;
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f1d0;
  pTVar11[2].m_description._M_string_length = 0;
  *(undefined4 *)&pTVar11[2].m_description.field_2 = 1;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x128);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar7->m_testCtx,"primitive_id_in_restarted",
             "test gl_PrimitiveIDIn with primitive restart");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 0;
  pTVar11[1].m_name.field_2._M_allocated_capacity = 0x1af8059;
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000006;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f1d0;
  pTVar11[2].m_description._M_string_length = 0;
  *(undefined4 *)&pTVar11[2].m_description.field_2 = 1;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x128);
  pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar7->m_testCtx,"primitive_id","test gl_PrimitiveID");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 0;
  pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_primitiveID";
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f1d0;
  pTVar11[2].m_description._M_string_length = 0;
  *(undefined4 *)&pTVar11[2].m_description.field_2 = 2;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  local_200 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_200,
             (pGVar25->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_primitive","Different input and output primitives.");
  local_208 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_208,
             (pGVar25->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "triangle_strip_adjacency","Different triangle_strip_adjacency vertex counts.");
  lVar27 = 0x10;
  do {
    pTVar11 = (TestNode *)operator_new(0x120);
    pCVar7 = (local_278->super_TestCaseGroup).m_context;
    pcVar9 = *(char **)((long)&init::layerTargets[3].desc + lVar27);
    uVar2 = *(undefined4 *)((long)&init::layerTargets[3].name + lVar27);
    uVar3 = *(undefined4 *)((long)&init::inputPrimitives[0].primitiveType + lVar27);
    tcu::TestCase::TestCase((TestCase *)pTVar11,pCVar7->m_testCtx,pcVar9,pcVar9);
    pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
    pTVar11[1].m_testCtx = (TestContext *)0x0;
    *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = 0;
    *(undefined4 *)((long)&pTVar11[1].m_name._M_dataplus._M_p + 4) = uVar2;
    *(undefined4 *)&pTVar11[1].m_name._M_string_length = uVar3;
    pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
    *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
    *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
    *(undefined8 *)&pTVar11[1].field_0x54 = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
    *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f2c0;
    pTVar11[2].m_description._M_string_length = 0;
    tcu::TestNode::addChild(local_200,pTVar11);
    lVar27 = lVar27 + 0x18;
  } while (lVar27 != 0x100);
  pTVar11 = (TestNode *)0x0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    local_218 = pTVar11;
    std::ostream::operator<<((ostringstream *)&local_1f8,(int)pTVar11);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
    plVar16 = (long *)std::__cxx11::string::replace
                                ((ulong)&stack0xfffffffffffffcc8,0,(char *)0x0,0x1c3abb9);
    local_318 = &local_308;
    puVar29 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar29) {
      local_308 = *puVar29;
      lStack_300 = plVar16[3];
    }
    else {
      local_308 = *puVar29;
      local_318 = (ulong *)*plVar16;
    }
    local_310 = plVar16[1];
    *plVar16 = (long)puVar29;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    if (in_stack_fffffffffffffcc8 != &local_328) {
      operator_delete(in_stack_fffffffffffffcc8,local_328 + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::ostream::operator<<((ostringstream *)&local_1f8,(int)local_218);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
    plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x1c3abc7);
    in_stack_fffffffffffffcc8 = &local_328;
    puVar29 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar29) {
      local_328 = *puVar29;
      lStack_320 = plVar16[3];
    }
    else {
      local_328 = *puVar29;
      in_stack_fffffffffffffcc8 = (ulong *)*plVar16;
    }
    *plVar16 = (long)puVar29;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    pTVar11 = (TestNode *)operator_new(0x128);
    pCVar7 = (local_278->super_TestCaseGroup).m_context;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar11,pCVar7->m_testCtx,(char *)local_318,
               (char *)in_stack_fffffffffffffcc8);
    pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
    pTVar11[1].m_testCtx = (TestContext *)0x0;
    pTVar11[1].m_name._M_dataplus._M_p = (pointer)0xd00000000;
    *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
    pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
    *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
    *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
    *(undefined8 *)&pTVar11[1].field_0x54 = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
    pTVar11[2].m_description._M_dataplus._M_p = (pointer)0x0;
    pTVar11[2].m_description._M_string_length = 0;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f3b0;
    *(int *)&pTVar11[2].m_description.field_2 = (int)local_218;
    tcu::TestNode::addChild(local_208,pTVar11);
    if (in_stack_fffffffffffffcc8 != &local_328) {
      operator_delete(in_stack_fffffffffffffcc8,local_328 + 1);
    }
    if (local_318 != &local_308) {
      operator_delete(local_318,local_308 + 1);
    }
    pTVar12 = local_38;
    uVar22 = (int)local_218 + 1;
    pTVar11 = (TestNode *)(ulong)uVar22;
  } while (uVar22 != 0xd);
  tcu::TestNode::addChild(local_38,local_200);
  tcu::TestNode::addChild(pTVar12,local_208);
  lVar27 = 0x10;
  do {
    pTVar11 = (TestNode *)operator_new(0x120);
    pCVar7 = (local_278->super_TestCaseGroup).m_context;
    pcVar9 = *(char **)((long)&init::inputPrimitives[9].outputType + lVar27);
    uVar2 = *(undefined4 *)((long)&init::inputPrimitives[9].name + lVar27);
    uVar3 = *(undefined4 *)((long)&init::conversionPrimitives[0].primitiveType + lVar27);
    tcu::TestCase::TestCase((TestCase *)pTVar11,pCVar7->m_testCtx,pcVar9,pcVar9);
    pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
    pTVar11[1].m_testCtx = (TestContext *)0x0;
    *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = 0;
    *(undefined4 *)((long)&pTVar11[1].m_name._M_dataplus._M_p + 4) = uVar2;
    *(undefined4 *)&pTVar11[1].m_name._M_string_length = uVar3;
    pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
    *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
    *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
    *(undefined8 *)&pTVar11[1].field_0x54 = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
    *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f2c0;
    pTVar11[2].m_description._M_string_length = 0;
    tcu::TestNode::addChild(local_78,pTVar11);
    lVar27 = lVar27 + 0x18;
  } while (lVar27 != 0xa0);
  lVar27 = 0;
  do {
    pcVar9 = *(char **)((long)&init::emitTests[0].name + lVar27);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,pcVar9,(allocator<char> *)&local_248);
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    puVar29 = (ulong *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar29) {
      local_2d8.field_2._M_allocated_capacity = *puVar29;
      local_2d8.field_2._8_8_ = plVar16[3];
    }
    else {
      local_2d8.field_2._M_allocated_capacity = *puVar29;
      local_2d8._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_2d8._M_string_length = plVar16[1];
    *plVar16 = (long)puVar29;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    iVar4 = *(int *)((long)&init::emitTests[0].emitCountA + lVar27);
    local_200 = (TestNode *)CONCAT44(local_200._4_4_,iVar4);
    std::ostream::operator<<((ostringstream *)&local_1f8,iVar4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
    uVar24 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      uVar24 = local_2d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < local_298._M_string_length + local_2d8._M_string_length) {
      uVar24 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        uVar24 = local_298.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < local_298._M_string_length + local_2d8._M_string_length)
      goto LAB_013cff76;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8._M_dataplus._M_p);
    }
    else {
LAB_013cff76:
      puVar17 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_2d8,(ulong)local_298._M_dataplus._M_p);
    }
    local_2f8 = &local_2e8;
    puVar29 = puVar17 + 2;
    if ((ulong *)*puVar17 == puVar29) {
      local_2e8 = *puVar29;
      lStack_2e0 = puVar17[3];
    }
    else {
      local_2e8 = *puVar29;
      local_2f8 = (ulong *)*puVar17;
    }
    local_2f0 = puVar17[1];
    *puVar17 = puVar29;
    puVar17[1] = 0;
    *(undefined1 *)puVar29 = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    puVar29 = &local_328;
    puVar30 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar30) {
      local_328 = *puVar30;
      lStack_320 = plVar16[3];
    }
    else {
      local_328 = *puVar30;
      puVar29 = (ulong *)*plVar16;
    }
    lVar28 = plVar16[1];
    *plVar16 = (long)puVar30;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    iVar4 = *(int *)((long)&init::emitTests[0].endCountA + lVar27);
    local_208 = (TestNode *)CONCAT44(local_208._4_4_,iVar4);
    std::ostream::operator<<((ostringstream *)&local_1f8,iVar4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
    uVar23 = 0xf;
    if (puVar29 != &local_328) {
      uVar23 = local_328;
    }
    if (uVar23 < (ulong)(local_268 + lVar28)) {
      uVar23 = 0xf;
      if (local_270 != local_260) {
        uVar23 = local_260[0];
      }
      if (uVar23 < (ulong)(local_268 + lVar28)) goto LAB_013d00ca;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)puVar29);
    }
    else {
LAB_013d00ca:
      puVar17 = (undefined8 *)
                std::__cxx11::string::_M_append(&stack0xfffffffffffffcc8,(ulong)local_270);
    }
    local_318 = &local_308;
    puVar30 = puVar17 + 2;
    if ((ulong *)*puVar17 == puVar30) {
      local_308 = *puVar30;
      lStack_300 = puVar17[3];
    }
    else {
      local_308 = *puVar30;
      local_318 = (ulong *)*puVar17;
    }
    local_310 = puVar17[1];
    *puVar17 = puVar30;
    puVar17[1] = 0;
    *(undefined1 *)puVar30 = 0;
    if (local_270 != local_260) {
      operator_delete(local_270,local_260[0] + 1);
    }
    if (puVar29 != &local_328) {
      operator_delete(puVar29,local_328 + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,pcVar9,&local_219);
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    puVar29 = (ulong *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar29) {
      local_298.field_2._M_allocated_capacity = *puVar29;
      local_298.field_2._8_8_ = plVar16[3];
    }
    else {
      local_298.field_2._M_allocated_capacity = *puVar29;
      local_298._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_298._M_string_length = plVar16[1];
    *plVar16 = (long)puVar29;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::ostream::operator<<((ostringstream *)&local_1f8,(int)local_200);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
    uVar24 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      uVar24 = local_298.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < local_240 + local_298._M_string_length) {
      uVar23 = 0xf;
      if (local_248 != local_238) {
        uVar23 = local_238[0];
      }
      if (uVar23 < local_240 + local_298._M_string_length) goto LAB_013d0310;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_248,0,(char *)0x0,(ulong)local_298._M_dataplus._M_p);
    }
    else {
LAB_013d0310:
      puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_248);
    }
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    puVar29 = puVar17 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar29) {
      local_2b8.field_2._M_allocated_capacity = *puVar29;
      local_2b8.field_2._8_8_ = puVar17[3];
    }
    else {
      local_2b8.field_2._M_allocated_capacity = *puVar29;
      local_2b8._M_dataplus._M_p = (pointer)*puVar17;
    }
    local_2b8._M_string_length = puVar17[1];
    *puVar17 = puVar29;
    puVar17[1] = 0;
    *(undefined1 *)puVar29 = 0;
    puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    puVar29 = puVar17 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar29) {
      local_2d8.field_2._M_allocated_capacity = *puVar29;
      local_2d8.field_2._8_8_ = puVar17[3];
    }
    else {
      local_2d8.field_2._M_allocated_capacity = *puVar29;
      local_2d8._M_dataplus._M_p = (pointer)*puVar17;
    }
    local_2d8._M_string_length = puVar17[1];
    *puVar17 = puVar29;
    puVar17[1] = 0;
    *(undefined1 *)(puVar17 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::ostream::operator<<((ostringstream *)&local_1f8,(int)local_208);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
    uVar24 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      uVar24 = local_2d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < local_60 + local_2d8._M_string_length) {
      uVar23 = 0xf;
      if (local_68 != local_58) {
        uVar23 = local_58[0];
      }
      if (uVar23 < local_60 + local_2d8._M_string_length) goto LAB_013d047f;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_68,0,(char *)0x0,(ulong)local_2d8._M_dataplus._M_p);
    }
    else {
LAB_013d047f:
      puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_68);
    }
    local_2f8 = &local_2e8;
    puVar29 = puVar17 + 2;
    if ((ulong *)*puVar17 == puVar29) {
      local_2e8 = *puVar29;
      lStack_2e0 = puVar17[3];
    }
    else {
      local_2e8 = *puVar29;
      local_2f8 = (ulong *)*puVar17;
    }
    local_2f0 = puVar17[1];
    *puVar17 = puVar29;
    puVar17[1] = 0;
    *(undefined1 *)puVar29 = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    puVar29 = &local_328;
    puVar30 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar30) {
      local_328 = *puVar30;
      lStack_320 = plVar16[3];
    }
    else {
      local_328 = *puVar30;
      puVar29 = (ulong *)*plVar16;
    }
    *plVar16 = (long)puVar30;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (local_270 != local_260) {
      operator_delete(local_270,local_260[0] + 1);
    }
    iVar4 = *(int *)((long)&init::emitTests[0].emitCountB + lVar27);
    local_218 = (TestNode *)CONCAT44(local_218._4_4_,iVar4);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::ostream::operator<<((ostringstream *)&local_1f8,(int)local_218);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x1c3ac22);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      psVar20 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_2b8.field_2._M_allocated_capacity = *psVar20;
        local_2b8.field_2._8_8_ = plVar16[3];
      }
      else {
        local_2b8.field_2._M_allocated_capacity = *psVar20;
        local_2b8._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_2b8._M_string_length = plVar16[1];
      *plVar16 = (long)psVar20;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      puVar30 = (ulong *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar30) {
        local_2d8.field_2._M_allocated_capacity = *puVar30;
        local_2d8.field_2._8_8_ = plVar16[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *puVar30;
        local_2d8._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_2d8._M_string_length = plVar16[1];
      *plVar16 = (long)puVar30;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::ostream::operator<<((ostringstream *)&local_1f8,0);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
      uVar24 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        uVar24 = local_2d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < local_268 + local_2d8._M_string_length) {
        uVar23 = 0xf;
        if (local_270 != local_260) {
          uVar23 = local_260[0];
        }
        if (uVar23 < local_268 + local_2d8._M_string_length) goto LAB_013d07da;
        puVar17 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_270,0,(char *)0x0,(ulong)local_2d8._M_dataplus._M_p);
      }
      else {
LAB_013d07da:
        puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_270)
        ;
      }
      local_2f8 = &local_2e8;
      puVar30 = puVar17 + 2;
      if ((ulong *)*puVar17 == puVar30) {
        local_2e8 = *puVar30;
        lStack_2e0 = puVar17[3];
      }
      else {
        local_2e8 = *puVar30;
        local_2f8 = (ulong *)*puVar17;
      }
      local_2f0 = puVar17[1];
      *puVar17 = puVar30;
      puVar17[1] = 0;
      *(undefined1 *)puVar30 = 0;
      std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_2f8);
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      if (local_270 != local_260) {
        operator_delete(local_270,local_260[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::ostream::operator<<((ostringstream *)&local_1f8,(int)local_218);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x1c3ac36);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      puVar30 = (ulong *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar30) {
        local_298.field_2._M_allocated_capacity = *puVar30;
        local_298.field_2._8_8_ = plVar16[3];
      }
      else {
        local_298.field_2._M_allocated_capacity = *puVar30;
        local_298._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_298._M_string_length = plVar16[1];
      *plVar16 = (long)puVar30;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      puVar30 = puVar17 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar30) {
        local_2b8.field_2._M_allocated_capacity = *puVar30;
        local_2b8.field_2._8_8_ = puVar17[3];
      }
      else {
        local_2b8.field_2._M_allocated_capacity = *puVar30;
        local_2b8._M_dataplus._M_p = (pointer)*puVar17;
      }
      local_2b8._M_string_length = puVar17[1];
      *puVar17 = puVar30;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::ostream::operator<<((ostringstream *)&local_1f8,0);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
      uVar24 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        uVar24 = local_2b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < local_240 + local_2b8._M_string_length) {
        uVar23 = 0xf;
        if (local_248 != local_238) {
          uVar23 = local_238[0];
        }
        if (uVar23 < local_240 + local_2b8._M_string_length) goto LAB_013d0ab9;
        puVar17 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_248,0,(char *)0x0,(ulong)local_2b8._M_dataplus._M_p);
      }
      else {
LAB_013d0ab9:
        puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_248)
        ;
      }
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      puVar30 = puVar17 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar30) {
        local_2d8.field_2._M_allocated_capacity = *puVar30;
        local_2d8.field_2._8_8_ = puVar17[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *puVar30;
        local_2d8._M_dataplus._M_p = (pointer)*puVar17;
      }
      local_2d8._M_string_length = puVar17[1];
      *puVar17 = puVar30;
      puVar17[1] = 0;
      *(undefined1 *)puVar30 = 0;
      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
      local_2f8 = &local_2e8;
      puVar30 = puVar17 + 2;
      if ((ulong *)*puVar17 == puVar30) {
        local_2e8 = *puVar30;
        lStack_2e0 = puVar17[3];
      }
      else {
        local_2e8 = *puVar30;
        local_2f8 = (ulong *)*puVar17;
      }
      local_2f0 = puVar17[1];
      *puVar17 = puVar30;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      std::__cxx11::string::_M_append(&stack0xfffffffffffffcc8,(ulong)local_2f8);
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_248 != local_238) {
        operator_delete(local_248,local_238[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_270 != local_260) {
        operator_delete(local_270,local_260[0] + 1);
      }
    }
    pTVar11 = (TestNode *)operator_new(0x138);
    pCVar7 = (local_278->super_TestCaseGroup).m_context;
    TVar5 = *(TestNodeType *)((long)&init::emitTests[0].outputType + lVar27);
    tcu::TestCase::TestCase((TestCase *)pTVar11,pCVar7->m_testCtx,(char *)local_318,(char *)puVar29)
    ;
    pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
    pTVar11[1].m_testCtx = (TestContext *)0x0;
    pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
    *(TestNodeType *)&pTVar11[1].m_name._M_string_length = TVar5;
    pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
    *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
    *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
    *(undefined8 *)&pTVar11[1].field_0x54 = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
    *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f420;
    pTVar11[2].m_description._M_string_length = 0;
    *(int *)&pTVar11[2].m_description.field_2 = (int)local_200;
    *(int *)((long)&pTVar11[2].m_description.field_2 + 4) = (int)local_208;
    *(int *)((long)&pTVar11[2].m_description.field_2 + 8) = (int)local_218;
    *(undefined4 *)((long)&pTVar11[2].m_description.field_2 + 0xc) = 0;
    pTVar11[2].m_nodeType = TVar5;
    tcu::TestNode::addChild(local_80,pTVar11);
    if (puVar29 != &local_328) {
      operator_delete(puVar29,local_328 + 1);
    }
    if (local_318 != &local_308) {
      operator_delete(local_318,local_308 + 1);
    }
    pTVar11 = local_40;
    lVar27 = lVar27 + 0x20;
    if (lVar27 == 0x2e0) {
      lVar27 = 0;
      do {
        pTVar12 = (TestNode *)operator_new(0x128);
        pCVar7 = (local_278->super_TestCaseGroup).m_context;
        local_218 = *(TestNode **)((long)&init::varyingTests[0].vertexOutputs + lVar27);
        uStack_210 = 0;
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar12,pCVar7->m_testCtx,
                   *(char **)((long)&init::varyingTests[0].name + lVar27),
                   *(char **)((long)&init::varyingTests[0].desc + lVar27));
        pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
        pTVar12[1].m_testCtx = (TestContext *)0x0;
        pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x400000000;
        *(undefined4 *)&pTVar12[1].m_name._M_string_length = 5;
        pTVar12[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
        *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0x10000000000;
        *(undefined4 *)&pTVar12[1].m_description._M_dataplus._M_p = 0x100;
        *(undefined8 *)((long)&pTVar12[1].m_description._M_dataplus._M_p + 4) = 0;
        *(undefined8 *)((long)&pTVar12[1].m_description._M_string_length + 4) = 0;
        *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 4) = 0;
        *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 0xc) = 0;
        *(undefined8 *)&pTVar12[1].field_0x54 = 0;
        *(undefined8 *)
         ((long)&pTVar12[1].m_children.
                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start + 4) = 0;
        *(undefined8 *)
         ((long)&pTVar12[1].m_children.
                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 4) = 0;
        *(undefined8 *)
         ((long)&pTVar12[1].m_children.
                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 4) = 0;
        *(undefined8 *)((long)&pTVar12[2]._vptr_TestNode + 4) = 0;
        *(undefined8 *)((long)&pTVar12[2].m_testCtx + 4) = 0;
        *(undefined8 *)((long)&pTVar12[2].m_name._M_dataplus._M_p + 4) = 0;
        *(undefined8 *)((long)&pTVar12[2].m_name._M_string_length + 4) = 0;
        *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 4) = 0;
        *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 0xc) = 0;
        *(undefined4 *)((long)&pTVar12[2].m_description._M_dataplus._M_p + 4) = 0;
        pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f510;
        pTVar12[2].m_description._M_string_length = 0;
        pTVar12[2].m_description.field_2._M_allocated_capacity = (size_type)local_218;
        tcu::TestNode::addChild(pTVar11,pTVar12);
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x78);
      lVar27 = 0;
      do {
        pcVar9 = init::tests[lVar27].testPrefix;
        lVar28 = 0x10;
        local_218 = (TestNode *)lVar27;
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,pcVar9,(allocator<char> *)&stack0xfffffffffffffcc8);
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_318);
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          plVar21 = plVar16 + 2;
          if ((pointer *)*plVar16 == (pointer *)plVar21) {
            local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar21;
            lStack_1e0 = plVar16[3];
          }
          else {
            local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar21;
            local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar16;
          }
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)plVar16[1];
          *plVar16 = (long)plVar21;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          if (local_318 != &local_308) {
            operator_delete(local_318,local_308 + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xfffffffffffffcc8,init::tests[lVar27].descPrefix,
                     (allocator<char> *)&local_2f8);
          plVar16 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffcc8);
          local_318 = &local_308;
          puVar30 = (ulong *)(plVar16 + 2);
          if ((ulong *)*plVar16 == puVar30) {
            local_308 = *puVar30;
            lStack_300 = plVar16[3];
          }
          else {
            local_308 = *puVar30;
            local_318 = (ulong *)*plVar16;
          }
          local_310 = plVar16[1];
          *plVar16 = (long)puVar30;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          if (puVar29 != &local_328) {
            operator_delete(puVar29,local_328 + 1);
          }
          pLVar18 = (LayeredRenderCase *)operator_new(0xc0);
          anon_unknown_1::LayeredRenderCase::LayeredRenderCase
                    (pLVar18,(local_278->super_TestCaseGroup).m_context,
                     (char *)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start,(char *)local_318,
                     *(LayeredRenderTargetType *)((long)&PTR_iterate_0215e3d0 + lVar28),
                     init::tests[lVar27].test);
          tcu::TestNode::addChild(local_228,(TestNode *)pLVar18);
          if (local_318 != &local_308) {
            operator_delete(local_318,local_308 + 1);
          }
          if ((pointer *)
              local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          lVar28 = lVar28 + 0x18;
        } while (lVar28 != 0x70);
        lVar27 = (long)local_218 + 1;
      } while (lVar27 != 6);
      lVar27 = 8;
      pGVar25 = local_278;
      do {
        pTVar11 = (TestNode *)operator_new(0x128);
        pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
        puVar29 = &local_328;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffcc8,"geometry_","");
        plVar16 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffcc8);
        local_318 = &local_308;
        puVar30 = (ulong *)(plVar16 + 2);
        if ((ulong *)*plVar16 == puVar30) {
          local_308 = *puVar30;
          lStack_300 = plVar16[3];
        }
        else {
          local_308 = *puVar30;
          local_318 = (ulong *)*plVar16;
        }
        local_310 = plVar16[1];
        *plVar16 = (long)puVar30;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_318);
        local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        plVar21 = plVar16 + 2;
        if ((pointer *)*plVar16 == (pointer *)plVar21) {
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar21;
          lStack_1e0 = plVar16[3];
        }
        else {
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar21;
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar16;
        }
        name_00 = local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar16[1];
        *plVar16 = (long)plVar21;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b8,"Geometry shader with ","");
        puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        puVar30 = puVar17 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar17 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar30) {
          local_2d8.field_2._M_allocated_capacity = *puVar30;
          local_2d8.field_2._8_8_ = puVar17[3];
        }
        else {
          local_2d8.field_2._M_allocated_capacity = *puVar30;
          local_2d8._M_dataplus._M_p = (pointer)*puVar17;
        }
        local_2d8._M_string_length = puVar17[1];
        *puVar17 = puVar30;
        puVar17[1] = 0;
        *(undefined1 *)(puVar17 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_2d8);
        local_2f8 = &local_2e8;
        puVar30 = (ulong *)(plVar16 + 2);
        if ((ulong *)*plVar16 == puVar30) {
          local_2e8 = *puVar30;
          lStack_2e0 = plVar16[3];
        }
        else {
          local_2e8 = *puVar30;
          local_2f8 = (ulong *)*plVar16;
        }
        local_2f0 = plVar16[1];
        *plVar16 = (long)puVar30;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        uVar2 = *(undefined4 *)((long)&init::invocationCases[0].name + lVar27);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar11,pCVar7->m_testCtx,(char *)name_00,(char *)local_2f8);
        pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
        pTVar11[1].m_testCtx = (TestContext *)0x0;
        pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
        *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
        pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
        *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
        *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
        *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
        *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
        *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
        *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
        *(undefined8 *)&pTVar11[1].field_0x54 = 0;
        *(undefined8 *)
         ((long)&pTVar11[1].m_children.
                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start + 4) = 0;
        *(undefined8 *)
         ((long)&pTVar11[1].m_children.
                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 4) = 0;
        *(undefined8 *)
         ((long)&pTVar11[1].m_children.
                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
        pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryInvocationCase_0215f650;
        *(undefined4 *)((long)&pTVar11[2].m_description._M_string_length + 4) = uVar2;
        pTVar11[2].m_description.field_2._M_allocated_capacity = 0;
        tcu::TestNode::addChild(local_250,pTVar11);
        if (local_2f8 != &local_2e8) {
          operator_delete(local_2f8,local_2e8 + 1);
        }
        pGVar25 = local_278;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if ((pointer *)
            local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (local_318 != &local_308) {
          operator_delete(local_318,local_308 + 1);
        }
        if (puVar29 != &local_328) {
          operator_delete(puVar29,local_328 + 1);
        }
        lVar27 = lVar27 + 0x10;
      } while (lVar27 != 0x58);
      lVar27 = 8;
      do {
        iVar4 = *(int *)((long)&init::invocationCases[0].name + lVar27);
        if (iVar4 != 1) {
          pTVar11 = (TestNode *)operator_new(0x128);
          pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
          puVar29 = &local_328;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffcc8,"geometry_output_different_","");
          plVar16 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffcc8);
          local_318 = &local_308;
          puVar30 = (ulong *)(plVar16 + 2);
          if ((ulong *)*plVar16 == puVar30) {
            local_308 = *puVar30;
            lStack_300 = plVar16[3];
          }
          else {
            local_308 = *puVar30;
            local_318 = (ulong *)*plVar16;
          }
          local_310 = plVar16[1];
          *plVar16 = (long)puVar30;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_318);
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          plVar21 = plVar16 + 2;
          if ((pointer *)*plVar16 == (pointer *)plVar21) {
            local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar21;
            lStack_1e0 = plVar16[3];
          }
          else {
            local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar21;
            local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar16;
          }
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)plVar16[1];
          *plVar16 = (long)plVar21;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar11,pCVar7->m_testCtx,
                     (char *)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start,
                     "Geometry shader invocation(s) with different emit counts");
          pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar11[1].m_testCtx = (TestContext *)0x0;
          pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
          *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
          pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
          *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
          *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
          *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
          *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
          *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
          *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
          *(undefined8 *)&pTVar11[1].field_0x54 = 0;
          *(undefined8 *)
           ((long)&pTVar11[1].m_children.
                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start + 4) = 0;
          *(undefined8 *)
           ((long)&pTVar11[1].m_children.
                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 4) = 0;
          *(undefined8 *)
           ((long)&pTVar11[1].m_children.
                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0x100000000;
          pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryInvocationCase_0215f650;
          *(int *)((long)&pTVar11[2].m_description._M_string_length + 4) = iVar4;
          pTVar11[2].m_description.field_2._M_allocated_capacity = 0;
          tcu::TestNode::addChild(local_250,pTVar11);
          if ((pointer *)
              local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          if (local_318 != &local_308) {
            operator_delete(local_318,local_308 + 1);
          }
          if (puVar29 != &local_328) {
            operator_delete(puVar29,local_328 + 1);
          }
        }
        lVar27 = lVar27 + 0x10;
      } while (lVar27 != 0x58);
      lVar27 = 0x10;
      do {
        local_318 = &local_308;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"invocation_per_layer_","");
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_318);
        local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        plVar21 = plVar16 + 2;
        if ((pointer *)*plVar16 == (pointer *)plVar21) {
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar21;
          lStack_1e0 = plVar16[3];
        }
        else {
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar21;
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar16;
        }
        local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar16[1];
        *plVar16 = (long)plVar21;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        if (local_318 != &local_308) {
          operator_delete(local_318,local_308 + 1);
        }
        puVar29 = &local_328;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffcc8,
                   "Render to multiple layers with multiple invocations, one invocation per layer, target "
                   ,"");
        plVar16 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffcc8);
        local_318 = &local_308;
        puVar30 = (ulong *)(plVar16 + 2);
        if ((ulong *)*plVar16 == puVar30) {
          local_308 = *puVar30;
          lStack_300 = plVar16[3];
        }
        else {
          local_308 = *puVar30;
          local_318 = (ulong *)*plVar16;
        }
        local_310 = plVar16[1];
        *plVar16 = (long)puVar30;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        if (puVar29 != &local_328) {
          operator_delete(puVar29,local_328 + 1);
        }
        pLVar18 = (LayeredRenderCase *)operator_new(0xc0);
        anon_unknown_1::LayeredRenderCase::LayeredRenderCase
                  (pLVar18,(local_278->super_TestCaseGroup).m_context,
                   (char *)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,(char *)local_318,
                   *(LayeredRenderTargetType *)((long)&PTR_iterate_0215e3d0 + lVar27),
                   TEST_INVOCATION_PER_LAYER);
        tcu::TestNode::addChild(local_250,(TestNode *)pLVar18);
        if (local_318 != &local_308) {
          operator_delete(local_318,local_308 + 1);
        }
        if ((pointer *)
            local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x70);
      lVar27 = 0x10;
      do {
        local_318 = &local_308;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,"multiple_layers_per_invocation_","");
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_318);
        local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        plVar21 = plVar16 + 2;
        if ((pointer *)*plVar16 == (pointer *)plVar21) {
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar21;
          lStack_1e0 = plVar16[3];
        }
        else {
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar21;
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar16;
        }
        local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar16[1];
        *plVar16 = (long)plVar21;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        if (local_318 != &local_308) {
          operator_delete(local_318,local_308 + 1);
        }
        puVar29 = &local_328;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffcc8,
                   "Render to multiple layers with multiple invocations, multiple layers per invocation, target "
                   ,"");
        plVar16 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffcc8);
        local_318 = &local_308;
        puVar30 = (ulong *)(plVar16 + 2);
        if ((ulong *)*plVar16 == puVar30) {
          local_308 = *puVar30;
          lStack_300 = plVar16[3];
        }
        else {
          local_308 = *puVar30;
          local_318 = (ulong *)*plVar16;
        }
        local_310 = plVar16[1];
        *plVar16 = (long)puVar30;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        if (puVar29 != &local_328) {
          operator_delete(puVar29,local_328 + 1);
        }
        pLVar18 = (LayeredRenderCase *)operator_new(0xc0);
        anon_unknown_1::LayeredRenderCase::LayeredRenderCase
                  (pLVar18,(local_278->super_TestCaseGroup).m_context,
                   (char *)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,(char *)local_318,
                   *(LayeredRenderTargetType *)((long)&PTR_iterate_0215e3d0 + lVar27),
                   TEST_MULTIPLE_LAYERS_PER_INVOCATION);
        tcu::TestNode::addChild(local_250,(TestNode *)pLVar18);
        if (local_318 != &local_308) {
          operator_delete(local_318,local_308 + 1);
        }
        if ((pointer *)
            local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x70);
      pTVar12 = (TestNode *)operator_new(0x130);
      pGVar25 = local_278;
      pCVar7 = (local_278->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar12,pCVar7->m_testCtx,"invocation_output_vary_by_attribute",
                 "Output varying number of vertices");
      pTVar11 = local_250;
      pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
      pTVar12[1].m_testCtx = (TestContext *)0x0;
      pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
      *(undefined4 *)&pTVar12[1].m_name._M_string_length = 5;
      pTVar12[1].m_name.field_2._M_allocated_capacity = (size_type)"a_emitCount";
      *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0x10000000000;
      *(undefined4 *)&pTVar12[1].m_description._M_dataplus._M_p = 0x100;
      *(undefined8 *)((long)&pTVar12[1].m_description._M_dataplus._M_p + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 0xc) = 0;
      *(undefined8 *)&pTVar12[1].field_0x54 = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_start + 4) = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2]._vptr_TestNode + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_testCtx + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name._M_dataplus._M_p + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 0xc) = 0;
      *(undefined4 *)((long)&pTVar12[2].m_description._M_dataplus._M_p + 4) = 0;
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f0e0;
      pTVar12[2].m_description._M_string_length = 0;
      pTVar12[2].m_description.field_2._M_allocated_capacity = 0x100000000;
      *(undefined4 *)((long)&pTVar12[2].m_description.field_2 + 8) = 0;
      tcu::TestNode::addChild(local_250,pTVar12);
      pTVar12 = (TestNode *)operator_new(0x130);
      pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar12,pCVar7->m_testCtx,"invocation_output_vary_by_uniform",
                 "Output varying number of vertices");
      pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
      pTVar12[1].m_testCtx = (TestContext *)0x0;
      pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
      *(undefined4 *)&pTVar12[1].m_name._M_string_length = 5;
      pTVar12[1].m_name.field_2._M_allocated_capacity = (size_type)"a_vertexNdx";
      *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0x10000000000;
      *(undefined4 *)&pTVar12[1].m_description._M_dataplus._M_p = 0x100;
      *(undefined8 *)((long)&pTVar12[1].m_description._M_dataplus._M_p + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 0xc) = 0;
      *(undefined8 *)&pTVar12[1].field_0x54 = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_start + 4) = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2]._vptr_TestNode + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_testCtx + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name._M_dataplus._M_p + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 0xc) = 0;
      *(undefined4 *)((long)&pTVar12[2].m_description._M_dataplus._M_p + 4) = 0;
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f0e0;
      pTVar12[2].m_description._M_string_length = 0;
      pTVar12[2].m_description.field_2._M_allocated_capacity = (size_type)&DAT_100000001;
      *(undefined4 *)((long)&pTVar12[2].m_description.field_2 + 8) = 0;
      tcu::TestNode::addChild(pTVar11,pTVar12);
      pTVar12 = (TestNode *)operator_new(0x130);
      pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar12,pCVar7->m_testCtx,"invocation_output_vary_by_texture",
                 "Output varying number of vertices");
      pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
      pTVar12[1].m_testCtx = (TestContext *)0x0;
      pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
      *(undefined4 *)&pTVar12[1].m_name._M_string_length = 5;
      pTVar12[1].m_name.field_2._M_allocated_capacity = (size_type)"a_vertexNdx";
      *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0x10000000000;
      *(undefined4 *)&pTVar12[1].m_description._M_dataplus._M_p = 0x100;
      *(undefined8 *)((long)&pTVar12[1].m_description._M_dataplus._M_p + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 0xc) = 0;
      *(undefined8 *)&pTVar12[1].field_0x54 = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_start + 4) = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2]._vptr_TestNode + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_testCtx + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name._M_dataplus._M_p + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 0xc) = 0;
      *(undefined4 *)((long)&pTVar12[2].m_description._M_dataplus._M_p + 4) = 0;
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f0e0;
      pTVar12[2].m_description._M_string_length = 0;
      pTVar12[2].m_description.field_2._M_allocated_capacity = 0x100000002;
      local_228 = (TestNode *)0x0;
      *(undefined4 *)((long)&pTVar12[2].m_description.field_2 + 8) = 0;
      tcu::TestNode::addChild(pTVar11,pTVar12);
      do {
        lVar27 = 0;
        bVar19 = true;
        do {
          bVar26 = bVar19;
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"draw_","");
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
          iVar4 = init::numDrawInstances[(long)local_228];
          std::ostream::operator<<((ostringstream *)&local_1f8,iVar4);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
          std::ios_base::~ios_base(local_188);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            uVar24 = local_2b8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_298._M_string_length + local_2b8._M_string_length) {
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              uVar24 = local_298.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar24 < local_298._M_string_length + local_2b8._M_string_length)
            goto LAB_013d1df7;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8._M_dataplus._M_p);
          }
          else {
LAB_013d1df7:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
          }
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          psVar20 = puVar17 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar20) {
            local_2d8.field_2._M_allocated_capacity = *psVar20;
            local_2d8.field_2._8_8_ = puVar17[3];
          }
          else {
            local_2d8.field_2._M_allocated_capacity = *psVar20;
            local_2d8._M_dataplus._M_p = (pointer)*puVar17;
          }
          local_2d8._M_string_length = puVar17[1];
          *puVar17 = psVar20;
          puVar17[1] = 0;
          *(undefined1 *)psVar20 = 0;
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_2d8);
          local_2f8 = &local_2e8;
          puVar29 = (ulong *)(plVar16 + 2);
          if ((ulong *)*plVar16 == puVar29) {
            local_2e8 = *puVar29;
            lStack_2e0 = plVar16[3];
          }
          else {
            local_2e8 = *puVar29;
            local_2f8 = (ulong *)*plVar16;
          }
          local_2f0 = plVar16[1];
          *plVar16 = (long)puVar29;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
          iVar6 = init::numDrawInvocations[lVar27];
          std::ostream::operator<<((ostringstream *)&local_1f8,iVar6);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
          std::ios_base::~ios_base(local_188);
          uVar23 = 0xf;
          if (local_2f8 != &local_2e8) {
            uVar23 = local_2e8;
          }
          if (uVar23 < (ulong)(local_268 + local_2f0)) {
            uVar23 = 0xf;
            if (local_270 != local_260) {
              uVar23 = local_260[0];
            }
            if (uVar23 < (ulong)(local_268 + local_2f0)) goto LAB_013d1f53;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_270,0,(char *)0x0,(ulong)local_2f8);
          }
          else {
LAB_013d1f53:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_270);
          }
          puVar30 = &local_328;
          puVar29 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar29) {
            local_328 = *puVar29;
            lStack_320 = puVar17[3];
          }
          else {
            local_328 = *puVar29;
            puVar30 = (ulong *)*puVar17;
          }
          *puVar17 = puVar29;
          puVar17[1] = 0;
          *(undefined1 *)puVar29 = 0;
          plVar16 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffcc8);
          local_318 = &local_308;
          puVar29 = (ulong *)(plVar16 + 2);
          if ((ulong *)*plVar16 == puVar29) {
            local_308 = *puVar29;
            lStack_300 = plVar16[3];
          }
          else {
            local_308 = *puVar29;
            local_318 = (ulong *)*plVar16;
          }
          local_310 = plVar16[1];
          *plVar16 = (long)puVar29;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          if (puVar30 != &local_328) {
            operator_delete(puVar30,local_328 + 1);
          }
          if (local_270 != local_260) {
            operator_delete(local_270,local_260[0] + 1);
          }
          if (local_2f8 != &local_2e8) {
            operator_delete(local_2f8,local_2e8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Draw ","");
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
          std::ostream::operator<<((ostringstream *)&local_1f8,iVar4);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
          std::ios_base::~ios_base(local_188);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            uVar24 = local_298.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_268 + local_298._M_string_length) {
            uVar23 = 0xf;
            if (local_270 != local_260) {
              uVar23 = local_260[0];
            }
            if (uVar23 < local_268 + local_298._M_string_length) goto LAB_013d218d;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_270,0,(char *)0x0,(ulong)local_298._M_dataplus._M_p);
          }
          else {
LAB_013d218d:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_270);
          }
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          puVar29 = puVar17 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar29) {
            local_2b8.field_2._M_allocated_capacity = *puVar29;
            local_2b8.field_2._8_8_ = puVar17[3];
          }
          else {
            local_2b8.field_2._M_allocated_capacity = *puVar29;
            local_2b8._M_dataplus._M_p = (pointer)*puVar17;
          }
          local_2b8._M_string_length = puVar17[1];
          *puVar17 = puVar29;
          puVar17[1] = 0;
          *(undefined1 *)puVar29 = 0;
          puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          puVar29 = puVar17 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar29) {
            local_2d8.field_2._M_allocated_capacity = *puVar29;
            local_2d8.field_2._8_8_ = puVar17[3];
          }
          else {
            local_2d8.field_2._M_allocated_capacity = *puVar29;
            local_2d8._M_dataplus._M_p = (pointer)*puVar17;
          }
          local_2d8._M_string_length = puVar17[1];
          *puVar17 = puVar29;
          puVar17[1] = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
          std::ostream::operator<<((ostringstream *)&local_1f8,iVar6);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
          std::ios_base::~ios_base(local_188);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            uVar24 = local_2d8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_240 + local_2d8._M_string_length) {
            uVar23 = 0xf;
            if (local_248 != local_238) {
              uVar23 = local_238[0];
            }
            if (uVar23 < local_240 + local_2d8._M_string_length) goto LAB_013d22f8;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_248,0,(char *)0x0,(ulong)local_2d8._M_dataplus._M_p);
          }
          else {
LAB_013d22f8:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_248);
          }
          local_2f8 = &local_2e8;
          puVar29 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar29) {
            local_2e8 = *puVar29;
            lStack_2e0 = puVar17[3];
          }
          else {
            local_2e8 = *puVar29;
            local_2f8 = (ulong *)*puVar17;
          }
          local_2f0 = puVar17[1];
          *puVar17 = puVar29;
          puVar17[1] = 0;
          *(undefined1 *)puVar29 = 0;
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_2f8);
          puVar29 = &local_328;
          puVar30 = (ulong *)(plVar16 + 2);
          if ((ulong *)*plVar16 == puVar30) {
            local_328 = *puVar30;
            lStack_320 = plVar16[3];
          }
          else {
            local_328 = *puVar30;
            puVar29 = (ulong *)*plVar16;
          }
          *plVar16 = (long)puVar30;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          if (local_2f8 != &local_2e8) {
            operator_delete(local_2f8,local_2e8 + 1);
          }
          if (local_248 != local_238) {
            operator_delete(local_248,local_238[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if (local_270 != local_260) {
            operator_delete(local_270,local_260[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          pTVar11 = (TestNode *)operator_new(0x128);
          pCVar7 = (local_278->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar11,pCVar7->m_testCtx,(char *)local_318,(char *)puVar29);
          pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar11[1].m_testCtx = (TestContext *)0x0;
          pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
          *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
          pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_offset";
          *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000001;
          *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
          *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
          *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
          *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
          *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
          *(undefined8 *)&pTVar11[1].field_0x54 = 0;
          *(undefined8 *)
           ((long)&pTVar11[1].m_children.
                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start + 4) = 0;
          *(undefined8 *)
           ((long)&pTVar11[1].m_children.
                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 4) = 0;
          *(undefined8 *)
           ((long)&pTVar11[1].m_children.
                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
          *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
          pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_0215f740;
          *(int *)&pTVar11[2].m_description._M_string_length = iVar4;
          *(int *)((long)&pTVar11[2].m_description._M_string_length + 4) = iVar6;
          pTVar11[2].m_description.field_2._M_allocated_capacity = 0;
          tcu::TestNode::addChild(local_250,pTVar11);
          if (puVar29 != &local_328) {
            operator_delete(puVar29,local_328 + 1);
          }
          if (local_318 != &local_308) {
            operator_delete(local_318,local_308 + 1);
          }
          lVar27 = 1;
          bVar19 = false;
        } while (bVar26);
        local_228 = (TestNode *)((long)local_228 + 1);
      } while (local_228 != (TestNode *)0x3);
      lVar27 = 0;
      local_228 = (TestNode *)0x3;
      pGVar25 = local_278;
      do {
        primitive = init::inputTypes[lVar27];
        lVar28 = 0;
        local_250 = (TestNode *)lVar27;
        do {
          uVar22 = init::primitiveTypes[lVar28];
          local_2f8 = &local_2e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"type_","");
          GVar10 = sglr::rr_util::mapGLGeometryShaderInputType(primitive);
          Functional::(anonymous_namespace)::inputTypeToGLString_abi_cxx11_
                    (&local_2d8,(_anonymous_namespace_ *)(ulong)GVar10,inputType);
          uVar23 = 0xf;
          if (local_2f8 != &local_2e8) {
            uVar23 = local_2e8;
          }
          if (uVar23 < local_2d8._M_string_length + local_2f0) {
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              uVar24 = local_2d8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar24 < local_2d8._M_string_length + local_2f0) goto LAB_013d2690;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_2d8,0,(char *)0x0,(ulong)local_2f8);
          }
          else {
LAB_013d2690:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_2f8,(ulong)local_2d8._M_dataplus._M_p);
          }
          puVar30 = &local_328;
          puVar29 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar29) {
            local_328 = *puVar29;
            lStack_320 = puVar17[3];
          }
          else {
            local_328 = *puVar29;
            puVar30 = (ulong *)*puVar17;
          }
          *puVar17 = puVar29;
          puVar17[1] = 0;
          *(undefined1 *)puVar29 = 0;
          plVar16 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffcc8);
          local_318 = &local_308;
          puVar29 = (ulong *)(plVar16 + 2);
          if ((ulong *)*plVar16 == puVar29) {
            local_308 = *puVar29;
            lStack_300 = plVar16[3];
          }
          else {
            local_308 = *puVar29;
            local_318 = (ulong *)*plVar16;
          }
          local_310 = plVar16[1];
          *plVar16 = (long)puVar29;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Functional::(anonymous_namespace)::primitiveTypeToString_abi_cxx11_
                    (&local_2b8,(_anonymous_namespace_ *)(ulong)uVar22,(GLenum)local_310);
          uVar23 = 0xf;
          if (local_318 != &local_308) {
            uVar23 = local_308;
          }
          if (uVar23 < local_2b8._M_string_length + local_310) {
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              uVar24 = local_2b8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar24 < local_2b8._M_string_length + local_310) goto LAB_013d27ab;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_2b8,0,(char *)0x0,(ulong)local_318);
          }
          else {
LAB_013d27ab:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_318,(ulong)local_2b8._M_dataplus._M_p);
          }
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          plVar16 = puVar17 + 2;
          if ((pointer *)*puVar17 == (pointer *)plVar16) {
            local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar16;
            lStack_1e0 = puVar17[3];
          }
          else {
            local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar16;
            local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*puVar17;
          }
          local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)puVar17[1];
          *puVar17 = plVar16;
          puVar17[1] = 0;
          *(undefined1 *)plVar16 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if (local_318 != &local_308) {
            operator_delete(local_318,local_308 + 1);
          }
          if (puVar30 != &local_328) {
            operator_delete(puVar30,local_328 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if (local_2f8 != &local_2e8) {
            operator_delete(local_2f8,local_2e8 + 1);
          }
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d8,"Shader input type ","");
          GVar10 = sglr::rr_util::mapGLGeometryShaderInputType(primitive);
          Functional::(anonymous_namespace)::inputTypeToGLString_abi_cxx11_
                    (&local_2b8,(_anonymous_namespace_ *)(ulong)GVar10,inputType_00);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            uVar24 = local_2d8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_2b8._M_string_length + local_2d8._M_string_length) {
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              uVar24 = local_2b8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar24 < local_2b8._M_string_length + local_2d8._M_string_length)
            goto LAB_013d2942;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_2b8,0,(char *)0x0,(ulong)local_2d8._M_dataplus._M_p);
          }
          else {
LAB_013d2942:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_2d8,(ulong)local_2b8._M_dataplus._M_p);
          }
          local_2f8 = &local_2e8;
          puVar29 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar29) {
            local_2e8 = *puVar29;
            lStack_2e0 = puVar17[3];
          }
          else {
            local_2e8 = *puVar29;
            local_2f8 = (ulong *)*puVar17;
          }
          local_2f0 = puVar17[1];
          *puVar17 = puVar29;
          puVar17[1] = 0;
          *(undefined1 *)puVar29 = 0;
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_2f8);
          puVar29 = &local_328;
          puVar30 = (ulong *)(plVar16 + 2);
          if ((ulong *)*plVar16 == puVar30) {
            local_328 = *puVar30;
            lStack_320 = plVar16[3];
          }
          else {
            local_328 = *puVar30;
            puVar29 = (ulong *)*plVar16;
          }
          lVar27 = plVar16[1];
          *plVar16 = (long)puVar30;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          Functional::(anonymous_namespace)::primitiveTypeToString_abi_cxx11_
                    (&local_298,(_anonymous_namespace_ *)(ulong)uVar22,(GLenum)lVar27);
          uVar23 = 0xf;
          if (puVar29 != &local_328) {
            uVar23 = local_328;
          }
          uVar1 = local_298._M_string_length + lVar27;
          if (uVar23 < uVar1) {
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              uVar24 = local_298.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar24 < uVar1) goto LAB_013d2a61;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)puVar29);
          }
          else {
LAB_013d2a61:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                (&stack0xfffffffffffffcc8,(ulong)local_298._M_dataplus._M_p);
          }
          local_318 = &local_308;
          puVar30 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar30) {
            local_308 = *puVar30;
            lStack_300 = puVar17[3];
          }
          else {
            local_308 = *puVar30;
            local_318 = (ulong *)*puVar17;
          }
          local_310 = puVar17[1];
          *puVar17 = puVar30;
          puVar17[1] = 0;
          *(undefined1 *)puVar30 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          if (puVar29 != &local_328) {
            operator_delete(puVar29,local_328 + 1);
          }
          if (local_2f8 != &local_2e8) {
            operator_delete(local_2f8,local_2e8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          lVar27 = 0;
          bVar19 = false;
          do {
            if (init::legalConversions[lVar27].inputType == primitive) {
              bVar19 = (bool)(bVar19 | init::legalConversions[lVar27].primitiveType == uVar22);
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 != 0xb);
          if (!bVar19) {
            pTVar11 = (TestNode *)operator_new(0x90);
            pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
            tcu::TestCase::TestCase
                      ((TestCase *)pTVar11,pCVar7->m_testCtx,
                       (char *)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start,(char *)local_318);
            pTVar11[1]._vptr_TestNode = (_func_int **)pCVar7;
            pTVar11->_vptr_TestNode = (_func_int **)&PTR__NegativeDrawCase_0215f830;
            pTVar11[1].m_testCtx = (TestContext *)0x0;
            pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
            *(deUint32 *)&pTVar11[1].m_name._M_string_length = primitive;
            *(uint *)((long)&pTVar11[1].m_name._M_string_length + 4) = uVar22;
            tcu::TestNode::addChild(local_70,pTVar11);
            pGVar25 = local_278;
          }
          if (local_318 != &local_308) {
            operator_delete(local_318,local_308 + 1);
          }
          if ((pointer *)
              local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1f8.pattern.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0xb);
        lVar27 = (long)local_250 + 1;
        if (lVar27 == 5) {
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar7->m_testCtx,"capture_vertex_line_loop",
                     "Capture line loop lines");
          pTVar11 = local_48;
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_0215f880;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_testCtx = (TestContext *)0x0;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          *(undefined8 *)((long)&pTVar12[1].m_name._M_dataplus._M_p + 4) = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name._M_string_length + 4) = 0;
          tcu::TestNode::addChild(local_48,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar7->m_testCtx,"capture_vertex_line_strip",
                     "Capture line strip lines");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_0215f880;
          pTVar12[1].m_testCtx = (TestContext *)0x100000000;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar7->m_testCtx,"capture_vertex_triangle_strip",
                     "Capture triangle strip triangles");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_0215f880;
          pTVar12[1].m_testCtx = (TestContext *)0x200000000;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar7->m_testCtx,"capture_vertex_triangle_fan",
                     "Capture triangle fan triangles");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_0215f880;
          pTVar12[1].m_testCtx = (TestContext *)0x300000000;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar7->m_testCtx,"capture_vertex_draw_arrays",
                     "Capture primitives generated with drawArrays");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_0215f880;
          pTVar12[1].m_testCtx = (TestContext *)0x400000000;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar7->m_testCtx,"capture_vertex_draw_arrays_instanced",
                     "Capture primitives generated with drawArraysInstanced");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_0215f880;
          pTVar12[1].m_testCtx = (TestContext *)0x400000001;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar7->m_testCtx,"capture_vertex_draw_arrays_indirect",
                     "Capture primitives generated with drawArraysIndirect");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_0215f880;
          pTVar12[1].m_testCtx = (TestContext *)0x400000002;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar7->m_testCtx,"capture_vertex_draw_elements",
                     "Capture primitives generated with drawElements");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_0215f880;
          pTVar12[1].m_testCtx = (TestContext *)0x400000003;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar7->m_testCtx,"capture_vertex_draw_elements_instanced",
                     "Capture primitives generated with drawElementsInstanced");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_0215f880;
          pTVar12[1].m_testCtx = (TestContext *)0x400000004;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar7->m_testCtx,"capture_vertex_draw_elements_indirect",
                     "Capture primitives generated with drawElementsIndirect");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_0215f880;
          pTVar12[1].m_testCtx = (TestContext *)0x400000005;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0x98);
          pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar7->m_testCtx,
                     "capture_vertex_draw_arrays_overflow_single_buffer",
                     "Capture triangles to too small a buffer");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackOverflowCase_0215f8d0;
          pTVar12[1].m_testCtx = (TestContext *)0x0;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0x98);
          pCVar7 = (pGVar25->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar7->m_testCtx,
                     "capture_vertex_draw_elements_overflow_single_buffer",
                     "Capture triangles to too small a buffer");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar7;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackOverflowCase_0215f8d0;
          *(undefined4 *)&pTVar12[1].m_testCtx = 1;
          *(undefined8 *)((long)&pTVar12[1].m_testCtx + 4) = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name._M_dataplus._M_p + 4) = 0;
          pTVar12[1].m_name._M_string_length = 0;
          pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          return extraout_EAX;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void GeometryShaderTests::init (void)
{
	struct PrimitiveTestSpec
	{
		deUint32	primitiveType;
		const char* name;
		deUint32	outputType;
	};

	struct EmitTestSpec
	{
		deUint32	outputType;
		int			emitCountA;		//!< primitive A emit count
		int			endCountA;		//!< primitive A end count
		int			emitCountB;		//!<
		int			endCountB;		//!<
		const char* name;
	};

	static const struct LayeredTarget
	{
		LayeredRenderCase::LayeredRenderTargetType	target;
		const char*									name;
		const char*									desc;
	} layerTargets[] =
	{
		{ LayeredRenderCase::TARGET_CUBE,			"cubemap",				"cubemap"						},
		{ LayeredRenderCase::TARGET_3D,				"3d",					"3D texture"					},
		{ LayeredRenderCase::TARGET_2D_ARRAY,		"2d_array",				"2D array texture"				},
		{ LayeredRenderCase::TARGET_2D_MS_ARRAY,	"2d_multisample_array",	"2D multisample array texture"	},
	};

	tcu::TestCaseGroup* const queryGroup				= new tcu::TestCaseGroup(m_testCtx, "query", "Query tests.");
	tcu::TestCaseGroup* const basicGroup				= new tcu::TestCaseGroup(m_testCtx, "basic", "Basic tests.");
	tcu::TestCaseGroup* const inputPrimitiveGroup		= new tcu::TestCaseGroup(m_testCtx, "input", "Different input primitives.");
	tcu::TestCaseGroup* const conversionPrimitiveGroup	= new tcu::TestCaseGroup(m_testCtx, "conversion", "Different input and output primitives.");
	tcu::TestCaseGroup* const emitGroup					= new tcu::TestCaseGroup(m_testCtx, "emit", "Different emit counts.");
	tcu::TestCaseGroup* const varyingGroup				= new tcu::TestCaseGroup(m_testCtx, "varying", "Test varyings.");
	tcu::TestCaseGroup* const layeredGroup				= new tcu::TestCaseGroup(m_testCtx, "layered", "Layered rendering.");
	tcu::TestCaseGroup* const instancedGroup			= new tcu::TestCaseGroup(m_testCtx, "instanced", "Instanced rendering.");
	tcu::TestCaseGroup* const negativeGroup				= new tcu::TestCaseGroup(m_testCtx, "negative", "Negative tests.");
	tcu::TestCaseGroup* const feedbackGroup				= new tcu::TestCaseGroup(m_testCtx, "vertex_transform_feedback", "Transform feedback.");

	this->addChild(queryGroup);
	this->addChild(basicGroup);
	this->addChild(inputPrimitiveGroup);
	this->addChild(conversionPrimitiveGroup);
	this->addChild(emitGroup);
	this->addChild(varyingGroup);
	this->addChild(layeredGroup);
	this->addChild(instancedGroup);
	this->addChild(negativeGroup);
	this->addChild(feedbackGroup);

	// query test
	{
		// limits with a corresponding glsl constant
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_input_components",				"", GL_MAX_GEOMETRY_INPUT_COMPONENTS,				"MaxGeometryInputComponents",		64));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_output_components",				"", GL_MAX_GEOMETRY_OUTPUT_COMPONENTS,				"MaxGeometryOutputComponents",		64));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_image_uniforms",					"", GL_MAX_GEOMETRY_IMAGE_UNIFORMS,					"MaxGeometryImageUniforms",			0));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_texture_image_units",			"", GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,			"MaxGeometryTextureImageUnits",		16));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_output_vertices",				"", GL_MAX_GEOMETRY_OUTPUT_VERTICES,				"MaxGeometryOutputVertices",		256));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_total_output_components",		"", GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS,		"MaxGeometryTotalOutputComponents",	1024));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_uniform_components",				"", GL_MAX_GEOMETRY_UNIFORM_COMPONENTS,				"MaxGeometryUniformComponents",		1024));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_atomic_counters",				"", GL_MAX_GEOMETRY_ATOMIC_COUNTERS,				"MaxGeometryAtomicCounters",		0));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_atomic_counter_buffers",			"", GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,			"MaxGeometryAtomicCounterBuffers",	0));

		// program queries
		queryGroup->addChild(new GeometryShaderVerticesQueryCase	(m_context, "geometry_linked_vertices_out",	"GL_GEOMETRY_LINKED_VERTICES_OUT"));
		queryGroup->addChild(new GeometryShaderInputQueryCase		(m_context, "geometry_linked_input_type",	"GL_GEOMETRY_LINKED_INPUT_TYPE"));
		queryGroup->addChild(new GeometryShaderOutputQueryCase		(m_context, "geometry_linked_output_type",	"GL_GEOMETRY_LINKED_OUTPUT_TYPE"));
		queryGroup->addChild(new GeometryShaderInvocationsQueryCase	(m_context, "geometry_shader_invocations",	"GL_GEOMETRY_SHADER_INVOCATIONS"));

		// limits
		queryGroup->addChild(new ImplementationLimitCase(m_context, "max_geometry_shader_invocations",		"", GL_MAX_GEOMETRY_SHADER_INVOCATIONS,		32));
		queryGroup->addChild(new ImplementationLimitCase(m_context, "max_geometry_uniform_blocks",			"", GL_MAX_GEOMETRY_UNIFORM_BLOCKS,			12));
		queryGroup->addChild(new ImplementationLimitCase(m_context, "max_geometry_shader_storage_blocks",	"", GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,	0));

		// layer_provoking_vertex_ext
		queryGroup->addChild(new LayerProvokingVertexQueryCase(m_context, "layer_provoking_vertex", "GL_LAYER_PROVOKING_VERTEX"));

		// primitives_generated
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_no_geometry",		"PRIMITIVES_GENERATED query with no geometry shader",								PrimitivesGeneratedQueryCase::TEST_NO_GEOMETRY));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_no_amplification",	"PRIMITIVES_GENERATED query with non amplifying geometry shader",					PrimitivesGeneratedQueryCase::TEST_NO_AMPLIFICATION));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_amplification",		"PRIMITIVES_GENERATED query with amplifying geometry shader",						PrimitivesGeneratedQueryCase::TEST_AMPLIFICATION));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_partial_primitives", "PRIMITIVES_GENERATED query with geometry shader emitting partial primitives",		PrimitivesGeneratedQueryCase::TEST_PARTIAL_PRIMITIVES));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_instanced",			"PRIMITIVES_GENERATED query with instanced geometry shader",						PrimitivesGeneratedQueryCase::TEST_INSTANCED));

		queryGroup->addChild(new PrimitivesGeneratedQueryObjectQueryCase(m_context, "primitives_generated", "Query bound PRIMITIVES_GENERATED query"));

		// fbo
		queryGroup->addChild(new ImplementationLimitCase				(m_context, "max_framebuffer_layers",				"", GL_MAX_FRAMEBUFFER_LAYERS,	256));
		queryGroup->addChild(new FramebufferDefaultLayersCase			(m_context, "framebuffer_default_layers",			""));
		queryGroup->addChild(new FramebufferAttachmentLayeredCase		(m_context, "framebuffer_attachment_layered",		""));
		queryGroup->addChild(new FramebufferIncompleteLayereTargetsCase	(m_context, "framebuffer_incomplete_layer_targets",	""));

		// resource query
		queryGroup->addChild(new ReferencedByGeometryShaderCase			(m_context, "referenced_by_geometry_shader",	""));

		// combined limits
		queryGroup->addChild(new CombinedGeometryUniformLimitCase		(m_context, "max_combined_geometry_uniform_components", "MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS"));
	}

	// basic tests
	{
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_10",				"Output 10 vertices",								OutputCountPatternSpec(10)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_128",				"Output 128 vertices",								OutputCountPatternSpec(128)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_256",				"Output 256 vertices",								OutputCountPatternSpec(256)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_max",				"Output max vertices",								OutputCountPatternSpec(-1)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_10_and_100",		"Output 10 and 100 vertices in two invocations",	OutputCountPatternSpec(10, 100)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_100_and_10",		"Output 100 and 10 vertices in two invocations",	OutputCountPatternSpec(100, 10)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_0_and_128",			"Output 0 and 128 vertices in two invocations",		OutputCountPatternSpec(0, 128)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_128_and_0",			"Output 128 and 0 vertices in two invocations",		OutputCountPatternSpec(128, 0)));

		basicGroup->addChild(new VaryingOutputCountCase		(m_context,	"output_vary_by_attribute",	"Output varying number of vertices",				VaryingOutputCountShader::READ_ATTRIBUTE,	VaryingOutputCountCase::MODE_WITHOUT_INSTANCING));
		basicGroup->addChild(new VaryingOutputCountCase		(m_context,	"output_vary_by_uniform",	"Output varying number of vertices",				VaryingOutputCountShader::READ_UNIFORM,		VaryingOutputCountCase::MODE_WITHOUT_INSTANCING));
		basicGroup->addChild(new VaryingOutputCountCase		(m_context,	"output_vary_by_texture",	"Output varying number of vertices",				VaryingOutputCountShader::READ_TEXTURE,		VaryingOutputCountCase::MODE_WITHOUT_INSTANCING));

		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"point_size",				"test gl_PointSize",								BuiltinVariableShader::TEST_POINT_SIZE));
		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"primitive_id_in",			"test gl_PrimitiveIDIn",							BuiltinVariableShader::TEST_PRIMITIVE_ID_IN));
		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"primitive_id_in_restarted","test gl_PrimitiveIDIn with primitive restart",		BuiltinVariableShader::TEST_PRIMITIVE_ID_IN, GeometryShaderRenderTest::FLAG_USE_RESTART_INDEX | GeometryShaderRenderTest::FLAG_USE_INDICES));
		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"primitive_id",				"test gl_PrimitiveID",								BuiltinVariableShader::TEST_PRIMITIVE_ID));
	}

	// input primitives
	{
		static const PrimitiveTestSpec inputPrimitives[] =
		{
			{ GL_POINTS,					"points",					GL_POINTS			},
			{ GL_LINES,						"lines",					GL_LINE_STRIP		},
			{ GL_LINE_LOOP,					"line_loop",				GL_LINE_STRIP		},
			{ GL_LINE_STRIP,				"line_strip",				GL_LINE_STRIP		},
			{ GL_TRIANGLES,					"triangles",				GL_TRIANGLE_STRIP	},
			{ GL_TRIANGLE_STRIP,			"triangle_strip",			GL_TRIANGLE_STRIP	},
			{ GL_TRIANGLE_FAN,				"triangle_fan",				GL_TRIANGLE_STRIP	},
			{ GL_LINES_ADJACENCY,			"lines_adjacency",			GL_LINE_STRIP		},
			{ GL_LINE_STRIP_ADJACENCY,		"line_strip_adjacency",		GL_LINE_STRIP		},
			{ GL_TRIANGLES_ADJACENCY,		"triangles_adjacency",		GL_TRIANGLE_STRIP	}
		};

		tcu::TestCaseGroup* const basicPrimitiveGroup		= new tcu::TestCaseGroup(m_testCtx, "basic_primitive",			"Different input and output primitives.");
		tcu::TestCaseGroup* const triStripAdjacencyGroup	= new tcu::TestCaseGroup(m_testCtx, "triangle_strip_adjacency",	"Different triangle_strip_adjacency vertex counts.");

		// more basic types
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(inputPrimitives); ++ndx)
			basicPrimitiveGroup->addChild(new GeometryExpanderRenderTest(m_context, inputPrimitives[ndx].name, inputPrimitives[ndx].name, inputPrimitives[ndx].primitiveType, inputPrimitives[ndx].outputType));

		// triangle strip adjacency with different vtx counts
		for (int vtxCount = 0; vtxCount <= 12; ++vtxCount)
		{
			const std::string name = "vertex_count_" + de::toString(vtxCount);
			const std::string desc = "Vertex count is " + de::toString(vtxCount);

			triStripAdjacencyGroup->addChild(new TriangleStripAdjacencyVertexCountTest(m_context, name.c_str(), desc.c_str(), vtxCount));
		}

		inputPrimitiveGroup->addChild(basicPrimitiveGroup);
		inputPrimitiveGroup->addChild(triStripAdjacencyGroup);
	}

	// different type conversions
	{
		static const PrimitiveTestSpec conversionPrimitives[] =
		{
			{ GL_TRIANGLES,		"triangles_to_points",	GL_POINTS			},
			{ GL_LINES,			"lines_to_points",		GL_POINTS			},
			{ GL_POINTS,		"points_to_lines",		GL_LINE_STRIP		},
			{ GL_TRIANGLES,		"triangles_to_lines",	GL_LINE_STRIP		},
			{ GL_POINTS,		"points_to_triangles",	GL_TRIANGLE_STRIP	},
			{ GL_LINES,			"lines_to_triangles",	GL_TRIANGLE_STRIP	}
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(conversionPrimitives); ++ndx)
			conversionPrimitiveGroup->addChild(new GeometryExpanderRenderTest(m_context, conversionPrimitives[ndx].name, conversionPrimitives[ndx].name, conversionPrimitives[ndx].primitiveType, conversionPrimitives[ndx].outputType));
	}

	// emit different amounts
	{
		static const EmitTestSpec emitTests[] =
		{
			{ GL_POINTS,			 0,		0,	0,	0,	"points"			},
			{ GL_POINTS,			 0,		1,	0,	0,	"points"			},
			{ GL_POINTS,			 1,		1,	0,	0,	"points"			},
			{ GL_POINTS,			 0,		2,	0,	0,	"points"			},
			{ GL_POINTS,			 1,		2,	0,	0,	"points"			},
			{ GL_LINE_STRIP,		 0,		0,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 0,		1,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 1,		1,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 2,		1,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 0,		2,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 1,		2,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 2,		2,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 2,		2,	2,	0,	"line_strip"		},
			{ GL_TRIANGLE_STRIP,	 0,		0,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 0,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 1,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 2,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 3,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 0,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 1,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 2,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 3,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 3,		2,	3,	0,	"triangle_strip"	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(emitTests); ++ndx)
		{
			std::string name = std::string(emitTests[ndx].name) + "_emit_" + de::toString(emitTests[ndx].emitCountA) + "_end_" + de::toString(emitTests[ndx].endCountA);
			std::string desc = std::string(emitTests[ndx].name) + " output, emit " + de::toString(emitTests[ndx].emitCountA) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountA) + " times";

			if (emitTests[ndx].emitCountB)
			{
				name += "_emit_" + de::toString(emitTests[ndx].emitCountB) + "_end_" + de::toString(emitTests[ndx].endCountB);
				desc += ", emit " + de::toString(emitTests[ndx].emitCountB) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountB) + " times";
			}

			emitGroup->addChild(new EmitTest(m_context, name.c_str(), desc.c_str(), emitTests[ndx].emitCountA, emitTests[ndx].endCountA, emitTests[ndx].emitCountB, emitTests[ndx].endCountB, emitTests[ndx].outputType));
		}
	}

	// varying
	{
		struct VaryingTestSpec
		{
			int			vertexOutputs;
			int			geometryOutputs;
			const char*	name;
			const char*	desc;
		};

		static const VaryingTestSpec varyingTests[] =
		{
			{ -1, 1, "vertex_no_op_geometry_out_1", "vertex_no_op_geometry_out_1" },
			{  0, 1, "vertex_out_0_geometry_out_1", "vertex_out_0_geometry_out_1" },
			{  0, 2, "vertex_out_0_geometry_out_2", "vertex_out_0_geometry_out_2" },
			{  1, 0, "vertex_out_1_geometry_out_0", "vertex_out_1_geometry_out_0" },
			{  1, 2, "vertex_out_1_geometry_out_2", "vertex_out_1_geometry_out_2" },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(varyingTests); ++ndx)
			varyingGroup->addChild(new VaryingTest(m_context, varyingTests[ndx].name, varyingTests[ndx].desc, varyingTests[ndx].vertexOutputs, varyingTests[ndx].geometryOutputs));
	}

	// layered
	{
		static const struct TestType
		{
			LayeredRenderCase::TestType	test;
			const char*					testPrefix;
			const char*					descPrefix;
		} tests[] =
		{
			{ LayeredRenderCase::TEST_DEFAULT_LAYER,			"render_with_default_layer_",	"Render to all layers of "					},
			{ LayeredRenderCase::TEST_SINGLE_LAYER,				"render_to_one_",				"Render to one layer of "					},
			{ LayeredRenderCase::TEST_ALL_LAYERS,				"render_to_all_",				"Render to all layers of "					},
			{ LayeredRenderCase::TEST_DIFFERENT_LAYERS,			"render_different_to_",			"Render different data to different layers"	},
			{ LayeredRenderCase::TEST_LAYER_ID,					"fragment_layer_",				"Read gl_Layer in fragment shader"			},
			{ LayeredRenderCase::TEST_LAYER_PROVOKING_VERTEX,	"layer_provoking_vertex_",		"Verify LAYER_PROVOKING_VERTEX"				},
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(layerTargets); ++targetNdx)
		{
			const std::string name = std::string(tests[testNdx].testPrefix) + layerTargets[targetNdx].name;
			const std::string desc = std::string(tests[testNdx].descPrefix) + layerTargets[targetNdx].desc;

			layeredGroup->addChild(new LayeredRenderCase(m_context, name.c_str(), desc.c_str(), layerTargets[targetNdx].target, tests[testNdx].test));
		}
	}

	// instanced
	{
		static const struct InvocationCase
		{
			const char* name;
			int			numInvocations;
		} invocationCases[] =
		{
			{ "1",		1  },
			{ "2",		2  },
			{ "8",		8  },
			{ "32",		32 },
			{ "max",	-1 },
		};
		static const int numDrawInstances[] = { 2, 4, 8 };
		static const int numDrawInvocations[] = { 2, 8 };

		// same amount of content to all invocations
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(invocationCases); ++ndx)
			instancedGroup->addChild(new GeometryInvocationCase(m_context,
																(std::string("geometry_") + invocationCases[ndx].name + "_invocations").c_str(),
																(std::string("Geometry shader with ") + invocationCases[ndx].name + " invocation(s)").c_str(),
																invocationCases[ndx].numInvocations,
																GeometryInvocationCase::CASE_FIXED_OUTPUT_COUNTS));

		// different amount of content to each invocation
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(invocationCases); ++ndx)
			if (invocationCases[ndx].numInvocations != 1)
				instancedGroup->addChild(new GeometryInvocationCase(m_context,
																	(std::string("geometry_output_different_") + invocationCases[ndx].name + "_invocations").c_str(),
																	"Geometry shader invocation(s) with different emit counts",
																	invocationCases[ndx].numInvocations,
																	GeometryInvocationCase::CASE_DIFFERENT_OUTPUT_COUNTS));

		// invocation per layer
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(layerTargets); ++targetNdx)
		{
			const std::string name = std::string("invocation_per_layer_") + layerTargets[targetNdx].name;
			const std::string desc = std::string("Render to multiple layers with multiple invocations, one invocation per layer, target ") + layerTargets[targetNdx].desc;

			instancedGroup->addChild(new LayeredRenderCase(m_context, name.c_str(), desc.c_str(), layerTargets[targetNdx].target, LayeredRenderCase::TEST_INVOCATION_PER_LAYER));
		}

		// multiple layers per invocation
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(layerTargets); ++targetNdx)
		{
			const std::string name = std::string("multiple_layers_per_invocation_") + layerTargets[targetNdx].name;
			const std::string desc = std::string("Render to multiple layers with multiple invocations, multiple layers per invocation, target ") + layerTargets[targetNdx].desc;

			instancedGroup->addChild(new LayeredRenderCase(m_context, name.c_str(), desc.c_str(), layerTargets[targetNdx].target, LayeredRenderCase::TEST_MULTIPLE_LAYERS_PER_INVOCATION));
		}

		// different invocation output counts depending on {uniform, attrib, texture}
		instancedGroup->addChild(new VaryingOutputCountCase(m_context,	"invocation_output_vary_by_attribute",	"Output varying number of vertices", VaryingOutputCountShader::READ_ATTRIBUTE,	VaryingOutputCountCase::MODE_WITH_INSTANCING));
		instancedGroup->addChild(new VaryingOutputCountCase(m_context,	"invocation_output_vary_by_uniform",	"Output varying number of vertices", VaryingOutputCountShader::READ_UNIFORM,	VaryingOutputCountCase::MODE_WITH_INSTANCING));
		instancedGroup->addChild(new VaryingOutputCountCase(m_context,	"invocation_output_vary_by_texture",	"Output varying number of vertices", VaryingOutputCountShader::READ_TEXTURE,	VaryingOutputCountCase::MODE_WITH_INSTANCING));

		// with drawInstanced
		for (int instanceNdx = 0; instanceNdx < DE_LENGTH_OF_ARRAY(numDrawInstances); ++instanceNdx)
		for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(numDrawInvocations); ++invocationNdx)
		{
			const std::string name = std::string("draw_") + de::toString(numDrawInstances[instanceNdx]) + "_instances_geometry_" + de::toString(numDrawInvocations[invocationNdx]) + "_invocations";
			const std::string desc = std::string("Draw ") + de::toString(numDrawInstances[instanceNdx]) + " instances, with " + de::toString(numDrawInvocations[invocationNdx]) + " geometry shader invocations.";

			instancedGroup->addChild(new DrawInstancedGeometryInstancedCase(m_context, name.c_str(), desc.c_str(), numDrawInstances[instanceNdx], numDrawInvocations[invocationNdx]));
		}
	}

	// negative (wrong types)
	{
		struct PrimitiveToInputTypeConversion
		{
			GLenum inputType;
			GLenum primitiveType;
		};

		static const PrimitiveToInputTypeConversion legalConversions[] =
		{
			{ GL_POINTS,				GL_POINTS					},
			{ GL_LINES,					GL_LINES					},
			{ GL_LINES,					GL_LINE_LOOP				},
			{ GL_LINES,					GL_LINE_STRIP				},
			{ GL_LINES_ADJACENCY,		GL_LINES_ADJACENCY			},
			{ GL_LINES_ADJACENCY,		GL_LINE_STRIP_ADJACENCY		},
			{ GL_TRIANGLES,				GL_TRIANGLES				},
			{ GL_TRIANGLES,				GL_TRIANGLE_STRIP			},
			{ GL_TRIANGLES,				GL_TRIANGLE_FAN				},
			{ GL_TRIANGLES_ADJACENCY,	GL_TRIANGLES_ADJACENCY		},
			{ GL_TRIANGLES_ADJACENCY,	GL_TRIANGLE_STRIP_ADJACENCY	},
		};

		static const GLenum inputTypes[] =
		{
			GL_POINTS,
			GL_LINES,
			GL_LINES_ADJACENCY,
			GL_TRIANGLES,
			GL_TRIANGLES_ADJACENCY
		};

		static const GLenum primitiveTypes[] =
		{
			GL_POINTS,
			GL_LINES,
			GL_LINE_LOOP,
			GL_LINE_STRIP,
			GL_LINES_ADJACENCY,
			GL_LINE_STRIP_ADJACENCY,
			GL_TRIANGLES,
			GL_TRIANGLE_STRIP,
			GL_TRIANGLE_FAN,
			GL_TRIANGLES_ADJACENCY,
			GL_TRIANGLE_STRIP_ADJACENCY
		};

		for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); ++inputTypeNdx)
		for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveTypeNdx)
		{
			const GLenum		inputType		= inputTypes[inputTypeNdx];
			const GLenum		primitiveType	= primitiveTypes[primitiveTypeNdx];
			const std::string	name			= std::string("type_") + inputTypeToGLString(sglr::rr_util::mapGLGeometryShaderInputType(inputType)) + "_primitive_" + primitiveTypeToString(primitiveType);
			const std::string	desc			= std::string("Shader input type ") + inputTypeToGLString(sglr::rr_util::mapGLGeometryShaderInputType(inputType)) + ", draw primitive type " + primitiveTypeToString(primitiveType);

			bool isLegal = false;

			for (int legalNdx = 0; legalNdx < DE_LENGTH_OF_ARRAY(legalConversions); ++legalNdx)
				if (legalConversions[legalNdx].inputType == inputType && legalConversions[legalNdx].primitiveType == primitiveType)
					isLegal = true;

			// only illegal
			if (!isLegal)
				negativeGroup->addChild(new NegativeDrawCase(m_context, name.c_str(), desc.c_str(), inputType, primitiveType));
		}
	}

	// vertex transform feedback
	{
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_line_loop",				"Capture line loop lines",									VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_LINE_LOOP));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_line_strip",				"Capture line strip lines",									VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_LINE_STRIP));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_triangle_strip",			"Capture triangle strip triangles",							VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_TRIANGLE_STRIP));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_triangle_fan",			"Capture triangle fan triangles",							VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_TRIANGLE_FAN));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_arrays",				"Capture primitives generated with drawArrays",				VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_arrays_instanced",	"Capture primitives generated with drawArraysInstanced",	VertexFeedbackCase::METHOD_DRAW_ARRAYS_INSTANCED,	VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_arrays_indirect",	"Capture primitives generated with drawArraysIndirect",		VertexFeedbackCase::METHOD_DRAW_ARRAYS_INDIRECT,	VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_elements",			"Capture primitives generated with drawElements",			VertexFeedbackCase::METHOD_DRAW_ELEMENTS,			VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_elements_instanced",	"Capture primitives generated with drawElementsInstanced",	VertexFeedbackCase::METHOD_DRAW_ELEMENTS_INSTANCED,	VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_elements_indirect",	"Capture primitives generated with drawElementsIndirect",	VertexFeedbackCase::METHOD_DRAW_ELEMENTS_INDIRECT,	VertexFeedbackCase::PRIMITIVE_POINTS));

		feedbackGroup->addChild(new VertexFeedbackOverflowCase(m_context, "capture_vertex_draw_arrays_overflow_single_buffer",		"Capture triangles to too small a buffer", VertexFeedbackOverflowCase::METHOD_DRAW_ARRAYS));
		feedbackGroup->addChild(new VertexFeedbackOverflowCase(m_context, "capture_vertex_draw_elements_overflow_single_buffer",	"Capture triangles to too small a buffer", VertexFeedbackOverflowCase::METHOD_DRAW_ELEMENTS));
	}
}